

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::DatatypeValidator> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  DatatypeValidator *t;
  DatatypeValidator *dv;
  DatatypeValidator *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::DatatypeValidator> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (DatatypeValidator *)
        BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (DatatypeValidator *)0x0; data < t;
        data = (DatatypeValidator *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      dv = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                     (&objToStore->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                      (XMLSize_t)data);
      DatatypeValidator::storeDV(serEng,dv);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<DatatypeValidator>* const objToStore
                                    , XSerializeEngine&                      serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            DatatypeValidator* data = objToStore->elementAt(i);
            DatatypeValidator::storeDV(serEng, data);
        }
    }

}